

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_ping_pong.c
# Opt level: O1

void handle_connect(cio_socket *socket,void *handler_context,cio_error err)

{
  long lVar1;
  cio_write_buffer *buffer;
  cio_error cVar2;
  cio_io_stream *stream;
  
  if (err == CIO_SUCCESS) {
    lVar1 = (long)handler_context + 0x110;
    *(long *)((long)handler_context + 0xf0) = lVar1;
    *(long *)((long)handler_context + 0xf8) = (long)handler_context + 400;
    *(long *)((long)handler_context + 0x108) = lVar1;
    *(long *)((long)handler_context + 0x100) = lVar1;
    stream = cio_socket_get_io_stream(socket);
    cio_buffered_stream_init((cio_buffered_stream *)((long)handler_context + 0x10),stream);
    buffer = (cio_write_buffer *)((long)handler_context + 0xd0);
    *(undefined8 *)((long)handler_context + 0xe0) = 0;
    *(undefined8 *)((long)handler_context + 0xe8) = 0;
    *(char **)((long)handler_context + 0xc0) = "Hello";
    *(undefined8 *)((long)handler_context + 200) = 6;
    *(cio_write_buffer **)((long)handler_context + 0xb0) = buffer;
    *(cio_write_buffer **)((long)handler_context + 0xb8) = buffer;
    *(long *)((long)handler_context + 0xd0) = (long)handler_context + 0xb0;
    *(long *)((long)handler_context + 0xd8) = (long)handler_context + 0xb0;
    *(long *)((long)handler_context + 0xe0) = *(long *)((long)handler_context + 0xe0) + 1;
    *(long *)((long)handler_context + 0xe8) = *(long *)((long)handler_context + 0xe8) + 6;
    cVar2 = cio_buffered_stream_write
                      ((cio_buffered_stream *)((long)handler_context + 0x10),buffer,
                       client_handle_write,handler_context);
    if (cVar2 == CIO_SUCCESS) {
      return;
    }
    handle_connect_cold_2();
  }
  else {
    handle_connect_cold_1();
  }
  cio_socket_close(socket);
  return;
}

Assistant:

static void handle_connect(struct cio_socket *socket, void *handler_context, enum cio_error err)
{
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "Connect failed!\n");
		cio_socket_close(socket);
		return;
	}

	struct client *client = (struct client *)handler_context;
	cio_read_buffer_init(&client->rb, client->buffer, sizeof(client->buffer));
	struct cio_buffered_stream *buffered_stream = &client->buffered_stream;
	cio_buffered_stream_init(buffered_stream, cio_socket_get_io_stream(socket));

	cio_write_buffer_head_init(&client->wbh);
	cio_write_buffer_const_element_init(&client->wb, HELLO, sizeof(HELLO));
	cio_write_buffer_queue_tail(&client->wbh, &client->wb);
	err = cio_buffered_stream_write(buffered_stream, &client->wbh, client_handle_write, client);

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "client write failed!\n");
		cio_socket_close(socket);
		return;
	}
}